

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::NetState::SerializeWithCachedSizes(NetState *this,CodedOutputStream *output)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint uVar1;
  int iVar2;
  char *data;
  void *pvVar3;
  Type *pTVar4;
  int index;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->phase_,output);
  }
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(2,this->level_,output);
  }
  iVar2 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    this_00 = &this->stage_;
    index = 0;
    do {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      data = (pTVar4->_M_dataplus)._M_p;
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar4->_M_string_length,SERIALIZE,"caffe.NetState.stage");
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::WriteString(3,pTVar4,output);
      index = index + 1;
    } while (iVar2 != index);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    return;
  }
  google::protobuf::internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void NetState::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.NetState)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.Phase phase = 1 [default = TEST];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->phase(), output);
  }

  // optional int32 level = 2 [default = 0];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->level(), output);
  }

  // repeated string stage = 3;
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->stage(i).data(), this->stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetState.stage");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->stage(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.NetState)
}